

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O2

int __thiscall ReadData::ReadRefPos(ReadData *this,FILE *file,uchar *HeadBuff)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  uchar *Message;
  size_t sVar5;
  undefined8 extraout_RAX;
  ostream *poVar6;
  int iVar7;
  
  if ((this->Head).MessageID == 0x2f) {
    lVar4 = (long)(this->Head).MessageLength;
    sVar5 = lVar4 + 4;
    iVar7 = -1;
    iVar3 = (int)sVar5;
    if (lVar4 < -4) {
      iVar3 = iVar7;
    }
    Message = (uchar *)operator_new__((long)iVar3);
    sVar5 = fread(Message,sVar5,1,(FILE *)file);
    if (sVar5 == 0) {
      iVar7 = 2;
    }
    else {
      iVar3 = (this->Head).MessageLength;
      bVar2 = CRCCheck(HeadBuff,Message,iVar3,iVar3);
      if (bVar2) {
        dVar1 = *(double *)(Message + 0x10);
        (this->UserPsrPos).B = *(double *)(Message + 8);
        (this->UserPsrPos).L = dVar1;
        (this->UserPsrPos).H = *(double *)(Message + 0x18);
        operator_delete__(Message);
        __cxa_begin_catch(extraout_RAX);
        poVar6 = std::operator<<((ostream *)&std::cout,"error happened when reading GPS ehpe");
        std::endl<char,std::char_traits<char>>(poVar6);
        __cxa_end_catch();
      }
      else {
        iVar7 = 3;
      }
    }
  }
  else {
    iVar7 = 6;
  }
  return iVar7;
}

Assistant:

int ReadData::ReadRefPos(FILE* file, unsigned char* HeadBuff) {
    if(Head.MessageID != 47)
        return CONFLICT_ID;
    
    char* buff = new char[Head.MessageLength + 4];
    if(!fread(buff, this->Head.MessageLength + 4, 1, file))
        return FILE_OR_BUFF_END;

    try {
        if(!CRCCheck(HeadBuff, (unsigned char*)buff, Head.MessageLength, Head.MessageLength))
            return CRC_FAILED;
        UserPsrPos.B = C2D(buff + 8, 8);
        UserPsrPos.L = C2D(buff + 16, 8);
        UserPsrPos.H = C2D(buff + 24, 8);
    } 
    catch(...) {
        cout << "error happened when reading GPS ehpe" << endl;
        return UNKNOWN_ERROR;
    }
    
    delete [] buff;
   
}